

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Status XML_StopParser(XML_Parser parser,XML_Bool resumable)

{
  XML_Parsing XVar1;
  XML_Bool resumable_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local._4_4_ = XML_STATUS_ERROR;
  }
  else {
    XVar1 = (parser->m_parsingStatus).parsing;
    if (XVar1 == XML_FINISHED) {
      parser->m_errorCode = XML_ERROR_FINISHED;
      parser_local._4_4_ = XML_STATUS_ERROR;
    }
    else {
      if (XVar1 == XML_SUSPENDED) {
        if (resumable != '\0') {
          parser->m_errorCode = XML_ERROR_SUSPENDED;
          return XML_STATUS_ERROR;
        }
        (parser->m_parsingStatus).parsing = XML_FINISHED;
      }
      else if (resumable == '\0') {
        (parser->m_parsingStatus).parsing = XML_FINISHED;
      }
      else {
        (parser->m_parsingStatus).parsing = XML_SUSPENDED;
      }
      parser_local._4_4_ = XML_STATUS_OK;
    }
  }
  return parser_local._4_4_;
}

Assistant:

enum XML_Status XMLCALL
XML_StopParser(XML_Parser parser, XML_Bool resumable) {
  if (parser == NULL)
    return XML_STATUS_ERROR;
  switch (parser->m_parsingStatus.parsing) {
  case XML_SUSPENDED:
    if (resumable) {
      parser->m_errorCode = XML_ERROR_SUSPENDED;
      return XML_STATUS_ERROR;
    }
    parser->m_parsingStatus.parsing = XML_FINISHED;
    break;
  case XML_FINISHED:
    parser->m_errorCode = XML_ERROR_FINISHED;
    return XML_STATUS_ERROR;
  default:
    if (resumable) {
#ifdef XML_DTD
      if (parser->m_isParamEntity) {
        parser->m_errorCode = XML_ERROR_SUSPEND_PE;
        return XML_STATUS_ERROR;
      }
#endif
      parser->m_parsingStatus.parsing = XML_SUSPENDED;
    } else
      parser->m_parsingStatus.parsing = XML_FINISHED;
  }
  return XML_STATUS_OK;
}